

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O3

void av1_cdef_filter_fb(uint8_t *dst8,uint16_t *dst16,int dstride,uint16_t *in,int xdec,int ydec,
                       int (*dir) [16],int *dirinit,int (*var) [16],int pli,cdef_list *dlist,
                       int cdef_count,int level,int sec_strength,int damping,int coeff_shift)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint16_t *__src;
  uint uVar20;
  int iVar21;
  ulong local_a0;
  cdef_filter_block_func cdef_filter_fn [4];
  
  bVar7 = (byte)coeff_shift & 0x1f;
  iVar21 = level << bVar7;
  iVar14 = sec_strength << ((byte)coeff_shift & 0x1f);
  bVar8 = 3 - (byte)xdec;
  bVar12 = 3 - (byte)ydec;
  if ((iVar21 == 0 && iVar14 == 0) && dirinit != (int *)0x0) {
    if (0 < cdef_count) {
      uVar20 = 1 << (bVar12 & 0x1f);
      if ((int)uVar20 < 2) {
        uVar20 = 1;
      }
      local_a0 = 0;
      do {
        if (ydec != -0x1c) {
          __src = in + (long)(int)((uint)dlist[local_a0].bx << (bVar8 & 0x1f)) +
                       (long)(int)((uint)dlist[local_a0].by << (bVar12 & 0x1f)) * 0x90;
          uVar19 = 0;
          do {
            memcpy(dst16 + (((int)uVar19 << (bVar8 & 0x1f)) +
                           ((int)local_a0 << (bVar12 + bVar8 & 0x1f))),__src,2L << (bVar8 & 0x3f));
            uVar19 = uVar19 + 1;
            __src = __src + 0x90;
          } while (uVar20 != uVar19);
        }
        local_a0 = local_a0 + 1;
      } while (local_a0 != (uint)cdef_count);
    }
  }
  else {
    if (pli == 1) {
      if (0 < cdef_count && xdec != ydec) {
        piVar11 = av1_cdef_filter_fb::conv422;
        if (xdec == 0) {
          piVar11 = av1_cdef_filter_fb::conv440;
        }
        uVar19 = 0;
        do {
          dir[dlist[uVar19].by][dlist[uVar19].bx] = piVar11[dir[dlist[uVar19].by][dlist[uVar19].bx]]
          ;
          uVar19 = uVar19 + 1;
        } while ((uint)cdef_count != uVar19);
      }
    }
    else if (pli == 0) {
      if (dirinit == (int *)0x0) {
        if (cdef_count < 2) {
          uVar19 = 0;
        }
        else {
          uVar19 = 0;
          do {
            bVar1 = dlist[uVar19].by;
            bVar2 = dlist[uVar19].bx;
            bVar3 = dlist[uVar19 + 1].by;
            bVar4 = dlist[uVar19 + 1].bx;
            (*cdef_find_dir_dual)
                      ((uint16_t *)((long)in + (ulong)((uint)bVar1 * 0x900) + (ulong)bVar2 * 0x10),
                       (uint16_t *)((long)in + (ulong)((uint)bVar3 * 0x900) + (ulong)bVar4 * 0x10),
                       0x90,var[bVar1] + bVar2,var[bVar3] + bVar4,coeff_shift,dir[bVar1] + bVar2,
                       dir[bVar3] + bVar4);
            uVar19 = uVar19 + 2;
          } while ((int)uVar19 < cdef_count + -1);
          uVar19 = uVar19 & 0xffffffff;
        }
        if ((cdef_count & 1U) != 0) {
          bVar1 = dlist[uVar19].by;
          bVar2 = dlist[uVar19].bx;
          iVar9 = (*cdef_find_dir)((uint16_t *)
                                   ((long)in + (ulong)((uint)bVar1 * 0x900) + (ulong)bVar2 * 0x10),
                                   0x90,var[bVar1] + bVar2,coeff_shift);
          dir[bVar1][bVar2] = iVar9;
        }
      }
      else if (*dirinit == 0) {
        if (cdef_count < 2) {
          uVar19 = 0;
        }
        else {
          uVar19 = 0;
          do {
            bVar1 = dlist[uVar19].by;
            bVar2 = dlist[uVar19].bx;
            bVar3 = dlist[uVar19 + 1].by;
            bVar4 = dlist[uVar19 + 1].bx;
            (*cdef_find_dir_dual)
                      ((uint16_t *)((long)in + (ulong)((uint)bVar1 * 0x900) + (ulong)bVar2 * 0x10),
                       (uint16_t *)((long)in + (ulong)((uint)bVar3 * 0x900) + (ulong)bVar4 * 0x10),
                       0x90,var[bVar1] + bVar2,var[bVar3] + bVar4,coeff_shift,dir[bVar1] + bVar2,
                       dir[bVar3] + bVar4);
            uVar19 = uVar19 + 2;
          } while ((int)uVar19 < cdef_count + -1);
          uVar19 = uVar19 & 0xffffffff;
        }
        if ((cdef_count & 1U) != 0) {
          bVar1 = dlist[uVar19].by;
          bVar2 = dlist[uVar19].bx;
          iVar9 = (*cdef_find_dir)((uint16_t *)
                                   ((long)in + (ulong)((uint)bVar1 * 0x900) + (ulong)bVar2 * 0x10),
                                   0x90,var[bVar1] + bVar2,coeff_shift);
          dir[bVar1][bVar2] = iVar9;
        }
        *dirinit = 1;
      }
    }
    iVar9 = damping + -1 + (uint)(pli == 0) + coeff_shift;
    uVar20 = 8 >> ((byte)xdec & 0x1f);
    uVar13 = 8 >> ((byte)ydec & 0x1f);
    if (dst8 == (uint8_t *)0x0) {
      cdef_filter_fn[0] = cdef_filter_16_0;
      cdef_filter_fn[1] = cdef_filter_16_1;
      cdef_filter_fn[2] = cdef_filter_16_2;
      cdef_filter_fn[3] = cdef_filter_16_3;
      if (0 < cdef_count) {
        iVar10 = 1 << (bVar8 & 0x1f);
        if (dirinit == (int *)0x0) {
          iVar10 = dstride;
        }
        uVar19 = 0;
        do {
          bVar1 = dlist[uVar19].by;
          bVar2 = dlist[uVar19].bx;
          iVar18 = iVar21;
          if (pli == 0) {
            uVar5 = var[bVar1][bVar2];
            iVar18 = 4;
            if (0x3f < uVar5) {
              uVar6 = 0x1f;
              if ((int)uVar5 >> 6 != 0) {
                for (; (uint)((int)uVar5 >> 6) >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              if ((uVar6 ^ 3) < 0xc) {
                iVar18 = (uVar6 ^ 0xffffffe0) + 0x24;
              }
              else {
                iVar18 = 0x10;
              }
            }
            iVar18 = iVar18 * iVar21 + 8 >> 4;
            if (uVar5 == 0) {
              iVar18 = 0;
            }
          }
          iVar15 = (uint)bVar2 << (bVar8 & 0x1f);
          iVar16 = (int)uVar19 << (bVar12 + bVar8 & 0x1f);
          if (dirinit == (int *)0x0) {
            iVar16 = ((uint)bVar1 << (bVar12 & 0x1f)) * dstride + iVar15;
          }
          if (level << bVar7 == 0) {
            iVar17 = 0;
          }
          else {
            iVar17 = dir[bVar1][(uint)bVar2];
          }
          (**(code **)((long)cdef_filter_fn +
                      (ulong)((uint)(iVar18 == 0) * 0x10 + (uint)(iVar14 == 0) * 8)))
                    (dst16 + iVar16,iVar10,
                     in + (int)(((uint)bVar1 * 0x90 << (bVar12 & 0x1f)) + iVar15),iVar18,iVar14,
                     iVar17,iVar9,iVar9,coeff_shift,uVar20,uVar13);
          uVar19 = uVar19 + 1;
        } while ((uint)cdef_count != uVar19);
      }
    }
    else {
      cdef_filter_fn[0] = cdef_filter_8_0;
      cdef_filter_fn[1] = cdef_filter_8_1;
      cdef_filter_fn[2] = cdef_filter_8_2;
      cdef_filter_fn[3] = cdef_filter_8_3;
      if (0 < cdef_count) {
        uVar19 = 0;
        do {
          bVar1 = dlist[uVar19].by;
          bVar2 = dlist[uVar19].bx;
          iVar10 = iVar21;
          if (pli == 0) {
            uVar5 = var[bVar1][bVar2];
            iVar10 = 4;
            if (0x3f < uVar5) {
              uVar6 = 0x1f;
              if ((int)uVar5 >> 6 != 0) {
                for (; (uint)((int)uVar5 >> 6) >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              if ((uVar6 ^ 3) < 0xc) {
                iVar10 = (uVar6 ^ 0xffffffe0) + 0x24;
              }
              else {
                iVar10 = 0x10;
              }
            }
            iVar10 = iVar10 * iVar21 + 8 >> 4;
            if (uVar5 == 0) {
              iVar10 = 0;
            }
          }
          iVar18 = (uint)bVar2 << (bVar8 & 0x1f);
          if (level << bVar7 == 0) {
            iVar16 = 0;
          }
          else {
            iVar16 = dir[bVar1][(uint)bVar2];
          }
          (**(code **)((long)cdef_filter_fn +
                      (ulong)((uint)(iVar10 == 0) * 0x10 + (uint)(iVar14 == 0) * 8)))
                    (dst8 + (int)(((uint)bVar1 << (bVar12 & 0x1f)) * dstride + iVar18),dstride,
                     in + (int)(((uint)bVar1 * 0x90 << (bVar12 & 0x1f)) + iVar18),iVar10,iVar14,
                     iVar16,iVar9,iVar9,coeff_shift,uVar20,uVar13);
          uVar19 = uVar19 + 1;
        } while ((uint)cdef_count != uVar19);
      }
    }
  }
  return;
}

Assistant:

void av1_cdef_filter_fb(uint8_t *dst8, uint16_t *dst16, int dstride,
                        const uint16_t *in, int xdec, int ydec,
                        int dir[CDEF_NBLOCKS][CDEF_NBLOCKS], int *dirinit,
                        int var[CDEF_NBLOCKS][CDEF_NBLOCKS], int pli,
                        cdef_list *dlist, int cdef_count, int level,
                        int sec_strength, int damping, int coeff_shift) {
  int bi;
  int bx;
  int by;
  const int pri_strength = level << coeff_shift;
  sec_strength <<= coeff_shift;
  damping += coeff_shift - (pli != AOM_PLANE_Y);
  const int bw_log2 = 3 - xdec;
  const int bh_log2 = 3 - ydec;
  if (dirinit && pri_strength == 0 && sec_strength == 0) {
    // If we're here, both primary and secondary strengths are 0, and
    // we still haven't written anything to y[] yet, so we just copy
    // the input to y[]. This is necessary only for av1_cdef_search()
    // and only av1_cdef_search() sets dirinit.
    for (bi = 0; bi < cdef_count; bi++) {
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      // TODO(stemidts/jmvalin): SIMD optimisations
      for (int iy = 0; iy < 1 << bh_log2; iy++) {
        memcpy(&dst16[(bi << (bw_log2 + bh_log2)) + (iy << bw_log2)],
               &in[((by << bh_log2) + iy) * CDEF_BSTRIDE + (bx << bw_log2)],
               ((size_t)1 << bw_log2) * sizeof(*dst16));
      }
    }
    return;
  }

  if (pli == 0) {
    if (!dirinit || !*dirinit) {
      aom_cdef_find_dir(in, dlist, var, cdef_count, coeff_shift, dir);
      if (dirinit) *dirinit = 1;
    }
  }
  if (pli == 1 && xdec != ydec) {
    for (bi = 0; bi < cdef_count; bi++) {
      static const int conv422[8] = { 7, 0, 2, 4, 5, 6, 6, 6 };
      static const int conv440[8] = { 1, 2, 2, 2, 3, 4, 6, 0 };
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      dir[by][bx] = (xdec ? conv422 : conv440)[dir[by][bx]];
    }
  }

  if (dst8) {
    const int block_width = 8 >> xdec;
    const int block_height = 8 >> ydec;
    /*
     * strength_index == 0 : enable_primary = 1, enable_secondary = 1
     * strength_index == 1 : enable_primary = 1, enable_secondary = 0
     * strength_index == 2 : enable_primary = 0, enable_secondary = 1
     * strength_index == 3 : enable_primary = 0, enable_secondary = 0
     */
    const cdef_filter_block_func cdef_filter_fn[4] = {
      cdef_filter_8_0, cdef_filter_8_1, cdef_filter_8_2, cdef_filter_8_3
    };

    for (bi = 0; bi < cdef_count; bi++) {
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      const int t =
          (pli ? pri_strength : adjust_strength(pri_strength, var[by][bx]));
      const int strength_index = (sec_strength == 0) | ((t == 0) << 1);

      cdef_filter_fn[strength_index](
          &dst8[(by << bh_log2) * dstride + (bx << bw_log2)], dstride,
          &in[(by * CDEF_BSTRIDE << bh_log2) + (bx << bw_log2)], t,
          sec_strength, pri_strength ? dir[by][bx] : 0, damping, damping,
          coeff_shift, block_width, block_height);
    }
  } else {
    const int block_width = 8 >> xdec;
    const int block_height = 8 >> ydec;
    /*
     * strength_index == 0 : enable_primary = 1, enable_secondary = 1
     * strength_index == 1 : enable_primary = 1, enable_secondary = 0
     * strength_index == 2 : enable_primary = 0, enable_secondary = 1
     * strength_index == 3 : enable_primary = 0, enable_secondary = 0
     */
    const cdef_filter_block_func cdef_filter_fn[4] = {
      cdef_filter_16_0, cdef_filter_16_1, cdef_filter_16_2, cdef_filter_16_3
    };

    for (bi = 0; bi < cdef_count; bi++) {
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      const int t =
          (pli ? pri_strength : adjust_strength(pri_strength, var[by][bx]));
      const int strength_index = (sec_strength == 0) | ((t == 0) << 1);

      cdef_filter_fn[strength_index](
          &dst16[dirinit ? bi << (bw_log2 + bh_log2)
                         : (by << bh_log2) * dstride + (bx << bw_log2)],
          dirinit ? 1 << bw_log2 : dstride,
          &in[(by * CDEF_BSTRIDE << bh_log2) + (bx << bw_log2)], t,
          sec_strength, pri_strength ? dir[by][bx] : 0, damping, damping,
          coeff_shift, block_width, block_height);
    }
  }
}